

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

int __thiscall cppcms::widgets::numeric<int>::value(numeric<int> *this)

{
  char cVar1;
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  cVar1 = cppcms::widgets::base_widget::set();
  if (cVar1 != '\0') {
    return this->value_;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Value not loaded",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

T value()
			{
				if(!set())
					throw cppcms_error("Value not loaded");
				return value_;
			}